

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O2

Result __thiscall wabt::WastParser::ParseLabelOpt(WastParser *this,string *out_label)

{
  bool bVar1;
  string *psVar2;
  Token local_70;
  
  bVar1 = PeekMatch(this,Last_String);
  if (bVar1) {
    Consume(&local_70,this);
    psVar2 = Token::text_abi_cxx11_(&local_70);
    std::__cxx11::string::_M_assign((string *)out_label,(string *)psVar2);
    Token::~Token(&local_70);
  }
  else {
    out_label->_M_string_length = 0;
    *(out_label->_M_dataplus)._M_p = '\0';
  }
  return (Result)Ok;
}

Assistant:

Result WastParser::ParseLabelOpt(std::string* out_label) {
  WABT_TRACE(ParseLabelOpt);
  if (PeekMatch(TokenType::Var)) {
    *out_label = Consume().text();
  } else {
    out_label->clear();
  }
  return Result::Ok;
}